

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

void VW::cmd_string_replace_value(stringstream **ss,string *flag_to_replace,string *new_value)

{
  stringstream *psVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  string cmd;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  std::__cxx11::string::append((char *)flag_to_replace);
  std::__cxx11::stringbuf::str();
  lVar2 = std::__cxx11::string::find((char *)&local_40,(ulong)(flag_to_replace->_M_dataplus)._M_p,0)
  ;
  if (lVar2 == -1) {
    psVar1 = *ss;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(psVar1 + 0x10)," ",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(psVar1 + 0x10),(flag_to_replace->_M_dataplus)._M_p,
                        flag_to_replace->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(new_value->_M_dataplus)._M_p,new_value->_M_string_length);
  }
  else {
    uVar4 = lVar2 + flag_to_replace->_M_string_length;
    lVar2 = std::__cxx11::string::find((char *)&local_40,0x274a0e,uVar4);
    if (lVar2 == -1) {
      lVar2 = local_38;
    }
    std::__cxx11::string::replace
              ((ulong)&local_40,uVar4,(char *)(lVar2 - uVar4),(ulong)(new_value->_M_dataplus)._M_p);
    std::__cxx11::stringbuf::str((string *)(*ss + 0x18));
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void cmd_string_replace_value(std::stringstream*& ss, string flag_to_replace, string new_value)
{
  flag_to_replace.append(
      " ");  // add a space to make sure we obtain the right flag in case 2 flags start with the same set of characters
  string cmd = ss->str();
  size_t pos = cmd.find(flag_to_replace);
  if (pos == string::npos)
    // flag currently not present in command string, so just append it to command string
    *ss << " " << flag_to_replace << new_value;
  else
  {
    // flag is present, need to replace old value with new value

    // compute position after flag_to_replace
    pos += flag_to_replace.size();

    // now pos is position where value starts
    // find position of next space
    size_t pos_after_value = cmd.find(" ", pos);
    if (pos_after_value == string::npos)
    {
      // we reach the end of the string, so replace the all characters after pos by new_value
      cmd.replace(pos, cmd.size() - pos, new_value);
    }
    else
    {
      // replace characters between pos and pos_after_value by new_value
      cmd.replace(pos, pos_after_value - pos, new_value);
    }

    ss->str(cmd);
  }
}